

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_RunLengthDecode.hh
# Opt level: O3

shared_ptr<QPDFStreamFilter> SF_RunLengthDecode::factory(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var1;
  element_type *in_RDI;
  shared_ptr<QPDFStreamFilter> sVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  pp_Var1[1] = (_func_int *)0x100000001;
  *pp_Var1 = (_func_int *)&PTR___Sp_counted_ptr_inplace_002ee5e0;
  pp_Var1[2] = (_func_int *)&PTR__SF_RunLengthDecode_002ee630;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  in_RDI->_vptr_QPDFStreamFilter = pp_Var1 + 2;
  in_RDI[1]._vptr_QPDFStreamFilter = pp_Var1;
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__SF_RunLengthDecode_002ee630;
  sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<QPDFStreamFilter>)
         sVar2.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<QPDFStreamFilter>
    factory()
    {
        return std::make_shared<SF_RunLengthDecode>();
    }